

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStream.cpp
# Opt level: O0

void FileStream_Close(TFileStream *pStream)

{
  TFileStream *pStream_local;
  
  if (pStream != (TFileStream *)0x0) {
    if (pStream->pMaster != (TFileStream *)0x0) {
      FileStream_Close(pStream->pMaster);
    }
    pStream->pMaster = (TFileStream *)0x0;
    if (pStream->StreamClose == (STREAM_CLOSE)0x0) {
      if (pStream->BaseClose != (STREAM_CLOSE)0x0) {
        (*pStream->BaseClose)(pStream);
      }
    }
    else {
      (*pStream->StreamClose)(pStream);
    }
    free(pStream);
  }
  return;
}

Assistant:

void FileStream_Close(TFileStream * pStream)
{
    // Check if the stream structure is allocated at all
    if(pStream != NULL)
    {
        // Free the master stream, if any
        if(pStream->pMaster != NULL)
            FileStream_Close(pStream->pMaster);
        pStream->pMaster = NULL;

        // Close the stream provider.
        if(pStream->StreamClose != NULL)
            pStream->StreamClose(pStream);

        // Also close base stream, if any
        else if(pStream->BaseClose != NULL)
            pStream->BaseClose(pStream);

        // Free the stream itself
        CASC_FREE(pStream);
    }
}